

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DictionaryTypeHandler.cpp
# Opt level: O1

void __thiscall
Js::DictionaryTypeHandlerBase<unsigned_short>::SetPropertyWithDescriptor<true>
          (DictionaryTypeHandlerBase<unsigned_short> *this,DynamicObject *instance,
          PropertyRecord *propertyRecord,DictionaryPropertyDescriptor<unsigned_short> **pdescriptor,
          Var value,PropertyOperationFlags flags,PropertyValueInfo *info)

{
  Type *pTVar1;
  PropertyAttributes PVar2;
  byte bVar3;
  DictionaryPropertyDescriptor<unsigned_short> *pDVar4;
  RecyclerWeakReference<Js::DynamicObject> *pRVar5;
  ScriptContext *scriptContext;
  JavascriptLibrary *pJVar6;
  code *pcVar7;
  uint propertyId;
  bool bVar8;
  unsigned_short uVar9;
  BOOL BVar10;
  undefined4 *puVar11;
  UndeclaredBlockVariable *pUVar12;
  Var aValue;
  RecyclableObject *function;
  PropertyOperationFlags index;
  DynamicObject *pDVar13;
  PropertyRecord *pPVar14;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *local_60;
  int i;
  PropertyRecord *local_50;
  PropertyRecord *propertyRecord_local;
  DictionaryTypeHandlerBase<unsigned_short> *local_40;
  uint local_38;
  PropertyOperationFlags local_34;
  
  local_50 = propertyRecord;
  local_40 = this;
  local_34 = flags;
  if ((pdescriptor == (DictionaryPropertyDescriptor<unsigned_short> **)0x0) ||
     (*pdescriptor == (DictionaryPropertyDescriptor<unsigned_short> *)0x0)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2e3,"(pdescriptor && *pdescriptor)","pdescriptor && *pdescriptor"
                               );
    if (!bVar8) goto LAB_00db2afb;
    *puVar11 = 0;
  }
  pDVar4 = *pdescriptor;
  local_38 = local_50->pid;
  if (instance == (DynamicObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2e6,"(instance)","instance");
    if (!bVar8) goto LAB_00db2afb;
    *puVar11 = 0;
  }
  if (((pDVar4->Attributes & 8) != 0) && ((pDVar4->flags & IsShadowed) == None)) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2e7,
                                "((descriptor->Attributes & 0x08) == 0 || (allowLetConstGlobal && descriptor->GetIsShadowed()))"
                                ,
                                "(descriptor->Attributes & PropertyDeleted) == 0 || (allowLetConstGlobal && descriptor->GetIsShadowed())"
                               );
    if (!bVar8) goto LAB_00db2afb;
    *puVar11 = 0;
  }
  if (((local_40->super_DynamicTypeHandler).flags & 0x18) != 0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2ea,"(!GetIsOrMayBecomeShared())","!GetIsOrMayBecomeShared()");
    if (!bVar8) goto LAB_00db2afb;
    *puVar11 = 0;
  }
  pRVar5 = (local_40->singletonInstance).ptr;
  if (pRVar5 == (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    pDVar13 = (DynamicObject *)0x0;
  }
  else {
    pDVar13 = (DynamicObject *)(pRVar5->super_RecyclerWeakReferenceBase).strongRef;
  }
  propertyRecord_local = (PropertyRecord *)value;
  if (pDVar13 != instance && pRVar5 != (RecyclerWeakReference<Js::DynamicObject> *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar11 = 1;
    bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                ,0x2ed,
                                "(this->singletonInstance == nullptr || localSingletonInstance == instance)"
                                ,
                                "this->singletonInstance == nullptr || localSingletonInstance == instance"
                               );
    if (!bVar8) goto LAB_00db2afb;
    *puVar11 = 0;
  }
  uVar9 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<true>(pDVar4);
  if (uVar9 == 0xffff) {
    uVar9 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(pDVar4);
    pPVar14 = propertyRecord_local;
    if (uVar9 != 0xffff) {
      uVar9 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(pDVar4);
      aValue = DynamicObject::GetSlot(instance,(uint)uVar9);
      function = VarTo<Js::RecyclableObject>(aValue);
      JavascriptOperators::CallSetter(function,instance,pPVar14,(ScriptContext *)0x0);
      bVar8 = JsUtil::
              BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
              ::TryGetReference<Js::PropertyRecord_const*>
                        ((BaseDictionary<Js::PropertyRecord_const*,Js::DictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,JsUtil::SimpleDictionaryEntry,JsUtil::NoResizeLock>
                          *)(local_40->propertyMap).ptr,&local_50,pdescriptor,(int *)&local_60);
      if (bVar8) {
        pDVar4 = *pdescriptor;
        uVar9 = DictionaryPropertyDescriptor<unsigned_short>::GetDataPropertyIndex<false>(pDVar4);
        if (uVar9 == 0xffff) {
          uVar9 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(pDVar4);
          if (uVar9 != 0xffff) {
            uVar9 = DictionaryPropertyDescriptor<unsigned_short>::GetSetterPropertyIndex(pDVar4);
            if (info != (PropertyValueInfo *)0x0) {
              PVar2 = pDVar4->Attributes;
              info->m_instance = &instance->super_RecyclableObject;
              info->m_propertyIndex = uVar9;
              info->m_attributes = PVar2;
              info->flags = InlineCacheSetterFlag;
            }
          }
        }
        else if (info != (PropertyValueInfo *)0x0) {
          PVar2 = pDVar4->Attributes;
          info->m_instance = &instance->super_RecyclableObject;
          info->m_propertyIndex = uVar9;
          info->m_attributes = PVar2;
          info->flags = InlineCacheNoFlags;
        }
      }
      else {
        *pdescriptor = (DictionaryPropertyDescriptor<unsigned_short> *)0x0;
      }
    }
  }
  else {
    if ((-1 < (char)(undefined1)local_34) && (0x3f < pDVar4->Attributes)) {
      scriptContext =
           (((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
           super_JavascriptLibraryBase).scriptContext.ptr;
      _i = pDVar13;
      pUVar12 = (UndeclaredBlockVariable *)DynamicObject::GetSlot(instance,(uint)uVar9);
      pDVar13 = _i;
      if ((((scriptContext->super_ScriptContextBase).javascriptLibrary)->undeclBlockVarSentinel).ptr
          == pUVar12) {
        JavascriptError::ThrowReferenceError(scriptContext,-0x7ff5ec07,(PCWSTR)0x0);
      }
    }
    pPVar14 = propertyRecord_local;
    index = (PropertyOperationFlags)uVar9;
    if ((pDVar4->flags & IsInitialized) == None) {
      if ((((local_34 & PropertyOperation_PreInit) == PropertyOperation_None) &&
          (pDVar4->flags = pDVar4->flags | IsInitialized, pDVar13 == instance)) &&
         ((local_34 & (PropertyOperation_NonFixedValue|PropertyOperation_SpecialValue)) ==
          PropertyOperation_None && 0xf < local_38)) {
        local_34 = index;
        if (propertyRecord_local == (PropertyRecord *)0x0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar11 = 1;
          bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                      ,0x305,"(value != nullptr)","value != nullptr");
          if (!bVar8) goto LAB_00db2afb;
          *puVar11 = 0;
        }
        BVar10 = RecyclableObject::IsExternal(&instance->super_RecyclableObject);
        if (BVar10 != 0) {
          AssertCount = AssertCount + 1;
          Throw::LogAssert();
          puVar11 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
          *puVar11 = 1;
          bVar8 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DictionaryTypeHandler.cpp"
                                      ,0x307,"(!instance->IsExternal())","!instance->IsExternal()");
          if (!bVar8) {
LAB_00db2afb:
            pcVar7 = (code *)invalidInstructionException();
            (*pcVar7)();
          }
          *puVar11 = 0;
        }
        bVar8 = VarIs<Js::JavascriptFunction>(pPVar14);
        if (bVar8) {
          bVar8 = Phases::IsEnabled((Phases *)&DAT_015bbe90,FixMethodPropsPhase);
          bVar8 = !bVar8;
        }
        else {
          bVar8 = Phases::IsEnabled((Phases *)&DAT_015bbe90,FixDataPropsPhase);
          if (bVar8) {
            bVar8 = false;
          }
          else {
            bVar8 = DynamicTypeHandler::CheckHeuristicsForFixedDataProps(instance,local_38,pPVar14);
          }
        }
        pDVar4->flags = bVar8 << 5 | pDVar4->flags & ~IsFixed;
        index = local_34;
      }
    }
    else {
      InvalidateFixedField<int>(local_40,instance,local_38,pDVar4);
    }
    pPVar14 = propertyRecord_local;
    DynamicTypeHandler::SetSlotUnchecked(instance,index,propertyRecord_local);
    if ((pDVar4->flags & (IsFixed|IsInitialized)) == IsInitialized) {
      if (info != (PropertyValueInfo *)0x0) {
        bVar3 = pDVar4->Attributes;
        info->m_instance = &instance->super_RecyclableObject;
        info->m_propertyIndex = uVar9;
        info->m_attributes = bVar3 >> 2 & 4 | bVar3;
        info->flags = InlineCacheNoFlags;
      }
    }
    else if (info != (PropertyValueInfo *)0x0) {
      info->m_instance = &instance->super_RecyclableObject;
      info->m_propertyIndex = 0xffff;
      info->m_attributes = '\0';
      info->flags = InlineCacheNoFlags;
    }
  }
  propertyId = local_38;
  bVar8 = NoSpecialPropertyCache::IsDefaultHandledSpecialProperty(local_38);
  if ((bVar8) &&
     (pTVar1 = &(local_40->super_DynamicTypeHandler).propertyTypes, *pTVar1 = *pTVar1 | 0x80,
     ((local_40->super_DynamicTypeHandler).flags & 0x20) != 0)) {
    pJVar6 = (((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
               super_JavascriptLibraryBase).scriptContext.ptr)->super_ScriptContextBase).
             javascriptLibrary;
    Memory::Recycler::WBSetBit((char *)&local_60);
    pPVar14 = propertyRecord_local;
    local_60 = &pJVar6->typesWithNoSpecialPropertyProtoChain;
    Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_60);
    PrototypeChainCache<Js::NoSpecialPropertyCache>::Clear(local_60);
  }
  DynamicTypeHandler::SetPropertyUpdateSideEffect
            (&local_40->super_DynamicTypeHandler,instance,propertyId,pPVar14,SideEffects_Any);
  return;
}

Assistant:

void DictionaryTypeHandlerBase<T>::SetPropertyWithDescriptor(
        _In_ DynamicObject* instance,
        _In_ PropertyRecord const* propertyRecord,
        _Inout_ DictionaryPropertyDescriptor<T> ** pdescriptor,
        _In_ Var value,
        _In_ PropertyOperationFlags flags,
        _Inout_opt_ PropertyValueInfo* info)
    {
        Assert(pdescriptor && *pdescriptor);
        DictionaryPropertyDescriptor<T> * descriptor = *pdescriptor;
        PropertyId propertyId = propertyRecord->GetPropertyId();
        Assert(instance);
        Assert((descriptor->Attributes & PropertyDeleted) == 0 || (allowLetConstGlobal && descriptor->GetIsShadowed()));

        // DictionaryTypeHandlers are not supposed to be shared.
        Assert(!GetIsOrMayBecomeShared());
#if ENABLE_FIXED_FIELDS
        DynamicObject* localSingletonInstance = this->singletonInstance != nullptr ? this->singletonInstance->Get() : nullptr;
        Assert(this->singletonInstance == nullptr || localSingletonInstance == instance);
#endif
        T dataSlotAllowLetConstGlobal = descriptor->template GetDataPropertyIndex<allowLetConstGlobal>();
        if (dataSlotAllowLetConstGlobal != NoSlots)
        {
            if (allowLetConstGlobal
                && (descriptor->Attributes & PropertyNoRedecl)
                && !(flags & PropertyOperation_AllowUndecl))
            {
                ScriptContext* scriptContext = instance->GetScriptContext();
                if (scriptContext->IsUndeclBlockVar(instance->GetSlot(dataSlotAllowLetConstGlobal)))
                {
                    JavascriptError::ThrowReferenceError(scriptContext, JSERR_UseBeforeDeclaration);
                }
            }
#if ENABLE_FIXED_FIELDS
            if (!descriptor->GetIsInitialized())
            {
                if ((flags & PropertyOperation_PreInit) == 0)
                {
                    descriptor->SetIsInitialized(true);
                    if (localSingletonInstance == instance && !IsInternalPropertyId(propertyId) &&
                        (flags & (PropertyOperation_NonFixedValue | PropertyOperation_SpecialValue)) == 0)
                    {
                        Assert(value != nullptr);
                        // We don't want fixed properties on external objects.  See DynamicObject::ResetObject for more information.
                        Assert(!instance->IsExternal());
                        descriptor->SetIsFixed(VarIs<JavascriptFunction>(value) ? ShouldFixMethodProperties() : (ShouldFixDataProperties() && CheckHeuristicsForFixedDataProps(instance, propertyId, value)));
                    }
                }
            }
            else
            {
                InvalidateFixedField(instance, propertyId, descriptor);
            }
#endif
            SetSlotUnchecked(instance, dataSlotAllowLetConstGlobal, value);
            // If we just added a fixed method, don't populate the inline cache so that we always take the slow path
            // when overwriting this property and correctly invalidate any JIT-ed code that hard-coded this method.
            if (!descriptor->IsOrMayBecomeFixed())
            {
                SetPropertyValueInfoNonFixed(info, instance, dataSlotAllowLetConstGlobal, GetLetConstGlobalPropertyAttributes<allowLetConstGlobal>(descriptor->Attributes));
            }
            else
            {
                PropertyValueInfo::SetNoCache(info, instance);
            }
        }
        else if (descriptor->GetSetterPropertyIndex() != NoSlots)
        {
            RecyclableObject* func = VarTo<RecyclableObject>(instance->GetSlot(descriptor->GetSetterPropertyIndex()));
            JavascriptOperators::CallSetter(func, instance, value, NULL);

            // Wait for the setter to return before setting up the inline cache info, as the setter may change
            // the attributes

            if (propertyMap->TryGetReference(propertyRecord, pdescriptor))
            {
                descriptor = *pdescriptor;
                T dataSlot = descriptor->template GetDataPropertyIndex<false>();
                if (dataSlot != NoSlots)
                {
                    SetPropertyValueInfoNonFixed(info, instance, dataSlot, descriptor->Attributes);
                }
                else if (descriptor->GetSetterPropertyIndex() != NoSlots)
                {
                    SetPropertyValueInfoNonFixed(info, instance, descriptor->GetSetterPropertyIndex(), descriptor->Attributes, InlineCacheSetterFlag);
                }
            }
            else
            {
                *pdescriptor = nullptr;
            }
        }
        if (NoSpecialPropertyCache::IsDefaultHandledSpecialProperty(propertyId))
        {
            this->SetHasSpecialProperties();
            if (GetFlags() & IsPrototypeFlag)
            {
                instance->GetScriptContext()->GetLibrary()->GetTypesWithNoSpecialPropertyProtoChainCache()->Clear();
            }
        }
        SetPropertyUpdateSideEffect(instance, propertyId, value, SideEffects_Any);
    }